

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

void Abc_NtkCompareCones(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  void **__ptr;
  void *pvVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Ptr_t *pVVar4;
  Vec_Ptr_t *__ptr_00;
  long lVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  size_t __size;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *local_40;
  void *local_38;
  
  __size = (long)pNtk->vCos->nSize << 2;
  pvVar2 = malloc(__size);
  pSupps = (int *)malloc(__size);
  pVVar3 = pNtk->vCos;
  iVar7 = pVVar3->nSize;
  if (0 < iVar7) {
    lVar12 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar3->pArray[lVar12];
      *(int *)((long)pvVar2 + lVar12 * 4) = (int)lVar12;
      pVVar3 = Abc_NtkNodeSupport(pNtk,&pObj,1);
      pSupps[lVar12] = pVVar3->nSize;
      if (pVVar3->pArray != (void **)0x0) {
        free(pVVar3->pArray);
        pVVar3->pArray = (void **)0x0;
      }
      if (pVVar3 != (Vec_Ptr_t *)0x0) {
        free(pVVar3);
      }
      lVar12 = lVar12 + 1;
      pVVar3 = pNtk->vCos;
      iVar7 = pVVar3->nSize;
    } while (lVar12 < iVar7);
  }
  local_38 = pvVar2;
  qsort(pvVar2,(long)iVar7,4,Abc_NtkCompareConesCompare);
  pVVar3 = pNtk->vCos;
  uVar6 = (ulong)(uint)pVVar3->nSize;
  if (0 < pVVar3->nSize) {
    lVar12 = 0;
    uVar8 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar3->pArray[lVar12];
      iVar7 = *(int *)((long)local_38 + lVar12 * 4);
      if (((long)iVar7 < 0) || ((int)uVar6 <= iVar7)) {
LAB_001f3e4b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pObj = (Abc_Obj_t *)pVVar3->pArray[iVar7];
      if ((pObj->field_0x14 & 0x10) == 0) {
        pVVar3 = Abc_NtkNodeSupport(pNtk,&pObj,1);
        pVVar4 = Abc_NtkDfsNodes(pNtk,&pObj,1);
        __ptr_00 = Abc_NtkDfsReverseNodesContained(pNtk,(Abc_Obj_t **)pVVar3->pArray,pVVar3->nSize);
        iVar7 = __ptr_00->nSize;
        lVar5 = (long)iVar7;
        uVar6 = 0;
        if (2 < lVar5) {
          uVar6 = 0;
          lVar9 = 1;
          do {
            if ((uint)(lVar5 + -1) <= iVar7 - 3U) goto LAB_001f3e4b;
            for (pvVar2 = __ptr_00->pArray[lVar9]; pvVar2 != (void *)0x0;
                pvVar2 = *(void **)((long)pvVar2 + 0x40)) {
              uVar6 = (ulong)((int)uVar6 + 1);
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 != lVar5 + -1);
        }
        if (iVar7 < 1) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
        }
        pvVar2 = __ptr_00->pArray[lVar5 + -1];
        local_40 = pVVar4;
        if (pvVar2 == (void *)0x0) {
          uVar10 = 0;
          uVar11 = 0;
        }
        else {
          uVar11 = 0;
          uVar10 = 0;
          do {
            uVar1 = *(uint *)((long)pvVar2 + 0x14);
            if ((uVar1 & 0xf) - 5 < 0xfffffffe) {
              __assert_fail("Abc_ObjIsCo(pTemp)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcUtil.c"
                            ,0x858,"void Abc_NtkCompareCones(Abc_Ntk_t *)");
            }
            uVar10 = (ulong)((int)uVar10 + 1);
            uVar11 = (ulong)((int)uVar11 + (uint)((uVar1 & 0x10) == 0));
            *(uint *)((long)pvVar2 + 0x14) = uVar1 | 0x10;
            pvVar2 = *(void **)((long)pvVar2 + 0x40);
          } while (pvVar2 != (void *)0x0);
        }
        uVar8 = uVar8 + 1;
        printf("%4d CO %5d :  Supp = %5d.  Lev = %3d.  Cone = %5d.  Rev = %5d.  COs = %3d (%3d).\n",
               (ulong)uVar8,(ulong)*(uint *)((long)local_38 + lVar12 * 4),(ulong)(uint)pVVar3->nSize
               ,(ulong)(*(uint *)((long)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray] + 0x14)
                       >> 0xc),(ulong)(uint)pVVar4->nSize,uVar6,uVar10,uVar11);
        __ptr = pVVar3->pArray;
        if (pVVar3->nSize < 10) {
          if (__ptr != (void **)0x0) {
            free(__ptr);
            pVVar3->pArray = (void **)0x0;
          }
          pVVar4 = local_40;
          if (pVVar3 != (Vec_Ptr_t *)0x0) {
            free(pVVar3);
          }
          if (pVVar4->pArray != (void **)0x0) {
            free(pVVar4->pArray);
            pVVar4->pArray = (void **)0x0;
          }
          if (pVVar4 != (Vec_Ptr_t *)0x0) {
            free(pVVar4);
          }
          if (__ptr_00->pArray != (void **)0x0) {
            free(__ptr_00->pArray);
            __ptr_00->pArray = (void **)0x0;
          }
          if (__ptr_00 != (Vec_Ptr_t *)0x0) {
            free(__ptr_00);
          }
          break;
        }
        if (__ptr != (void **)0x0) {
          free(__ptr);
          pVVar3->pArray = (void **)0x0;
        }
        pVVar4 = local_40;
        if (pVVar3 != (Vec_Ptr_t *)0x0) {
          free(pVVar3);
        }
        if (pVVar4->pArray != (void **)0x0) {
          free(pVVar4->pArray);
          pVVar4->pArray = (void **)0x0;
        }
        if (pVVar4 != (Vec_Ptr_t *)0x0) {
          free(pVVar4);
        }
        if (__ptr_00->pArray != (void **)0x0) {
          free(__ptr_00->pArray);
          __ptr_00->pArray = (void **)0x0;
        }
        if (__ptr_00 != (Vec_Ptr_t *)0x0) {
          free(__ptr_00);
        }
      }
      lVar12 = lVar12 + 1;
      pVVar3 = pNtk->vCos;
      uVar6 = (ulong)pVVar3->nSize;
    } while (lVar12 < (long)uVar6);
  }
  pVVar3 = pNtk->vCos;
  if (0 < pVVar3->nSize) {
    lVar12 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar3->pArray[lVar12];
      pObj->field_0x14 = pObj->field_0x14 & 0xef;
      lVar12 = lVar12 + 1;
      pVVar3 = pNtk->vCos;
    } while (lVar12 < pVVar3->nSize);
  }
  if (local_38 != (void *)0x0) {
    free(local_38);
  }
  if (pSupps != (int *)0x0) {
    free(pSupps);
    pSupps = (int *)0x0;
  }
  return;
}

Assistant:

void Abc_NtkCompareCones( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vSupp, * vNodes, * vReverse;
    Abc_Obj_t * pObj, * pTemp;
    int Iter, i, k, Counter, CounterCos, CounterCosNew;
    int * pPerms;

    // sort COs by support size
    pPerms = ABC_ALLOC( int, Abc_NtkCoNum(pNtk) );
    pSupps = ABC_ALLOC( int, Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pPerms[i] = i;
        vSupp = Abc_NtkNodeSupport( pNtk, &pObj, 1 );
        pSupps[i] = Vec_PtrSize(vSupp);
        Vec_PtrFree( vSupp );
    }
    qsort( (void *)pPerms, Abc_NtkCoNum(pNtk), sizeof(int), (int (*)(const void *, const void *)) Abc_NtkCompareConesCompare );

    // consider COs in this order
    Iter = 0;
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pObj = Abc_NtkCo( pNtk, pPerms[i] );
        if ( pObj->fMarkA )
            continue;
        Iter++;

        vSupp = Abc_NtkNodeSupport( pNtk, &pObj, 1 );
        vNodes = Abc_NtkDfsNodes( pNtk, &pObj, 1 );
        vReverse = Abc_NtkDfsReverseNodesContained( pNtk, (Abc_Obj_t **)Vec_PtrArray(vSupp), Vec_PtrSize(vSupp) );
        // count the number of nodes in the reverse cone
        Counter = 0;
        for ( k = 1; k < Vec_PtrSize(vReverse) - 1; k++ )
            for ( pTemp = (Abc_Obj_t *)Vec_PtrEntry(vReverse, k); pTemp; pTemp = (Abc_Obj_t *)pTemp->pCopy )
                Counter++;
        CounterCos = CounterCosNew = 0;
        for ( pTemp = (Abc_Obj_t *)Vec_PtrEntryLast(vReverse); pTemp; pTemp = (Abc_Obj_t *)pTemp->pCopy )
        {
            assert( Abc_ObjIsCo(pTemp) );
            CounterCos++;
            if ( pTemp->fMarkA == 0 )
                CounterCosNew++;
            pTemp->fMarkA = 1;
        }
        // print statistics
        printf( "%4d CO %5d :  Supp = %5d.  Lev = %3d.  Cone = %5d.  Rev = %5d.  COs = %3d (%3d).\n",
            Iter, pPerms[i], Vec_PtrSize(vSupp), Abc_ObjLevel(Abc_ObjFanin0(pObj)), Vec_PtrSize(vNodes), Counter, CounterCos, CounterCosNew );

        if ( Vec_PtrSize(vSupp) < 10 )
        {
            // free arrays
            Vec_PtrFree( vSupp );
            Vec_PtrFree( vNodes );
            Vec_PtrFree( vReverse );
            break;
        }

        // free arrays
        Vec_PtrFree( vSupp );
        Vec_PtrFree( vNodes );
        Vec_PtrFree( vReverse );

    }
    Abc_NtkForEachCo( pNtk, pObj, i )
        pObj->fMarkA = 0;

    ABC_FREE( pPerms );
    ABC_FREE( pSupps );
}